

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O3

string * __thiscall
toml::detail::character_in_range::name_abi_cxx11_
          (string *__return_storage_ptr__,character_in_range *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int in_EDX;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  show_char_abi_cxx11_(&local_40,(detail *)(ulong)this->from_,in_EDX);
  pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40,0,
                   0,"character_in_range{",0x13);
  local_60._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == paVar4) {
    local_60.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
    local_60.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  local_60._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append(&local_60,",");
  paVar4 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p == paVar5) {
    local_a0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_a0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_a0._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_a0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  local_a0._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  show_char_abi_cxx11_(&local_80,(detail *)(ulong)this->to_,(int)local_a0._M_string_length);
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar4) {
    uVar6 = local_a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar6 < local_80._M_string_length + local_a0._M_string_length) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      uVar6 = local_80.field_2._M_allocated_capacity;
    }
    if (local_80._M_string_length + local_a0._M_string_length <= (ulong)uVar6) {
      pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_80,0,0,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      goto LAB_0035336b;
    }
  }
  pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_a0,local_80._M_dataplus._M_p,local_80._M_string_length);
LAB_0035336b:
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if (paVar1 == paVar5) {
    local_c0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_c0.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
  }
  else {
    local_c0.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
  }
  local_c0._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  paVar5->_M_local_buf[0] = '\0';
  pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append(&local_c0,"}");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pbVar3->_M_dataplus)._M_p;
  paVar5 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar5) {
    uVar6 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar5->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar4) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string character_in_range::name() const
{
    return "character_in_range{" + show_char(from_) + "," + show_char(to_) + "}";
}